

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O2

string * __thiscall
absl::strings_internal::BigUnsigned<4>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BigUnsigned<4> *this)

{
  pointer pcVar1;
  size_type sVar2;
  BigUnsigned<4> copy;
  
  copy.words_[3] = this->words_[3];
  copy.size_ = this->size_;
  copy.words_[0] = this->words_[0];
  copy.words_[1] = this->words_[1];
  copy.words_[2] = this->words_[2];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (0 < copy.size_) {
    DivMod<10u>(&copy);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  sVar2 = __return_storage_ptr__->_M_string_length;
  if (sVar2 == 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    sVar2 = __return_storage_ptr__->_M_string_length;
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string BigUnsigned<max_words>::ToString() const {
  BigUnsigned<max_words> copy = *this;
  std::string result;
  // Build result in reverse order
  while (copy.size() > 0) {
    uint32_t next_digit = copy.DivMod<10>();
    result.push_back('0' + static_cast<char>(next_digit));
  }
  if (result.empty()) {
    result.push_back('0');
  }
  std::reverse(result.begin(), result.end());
  return result;
}